

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O2

int __thiscall
jrtplib::RTPUDPv6Transmitter::WaitForIncomingData
          (RTPUDPv6Transmitter *this,RTPTime *delay,bool *dataavailable)

{
  int iVar1;
  int iVar2;
  int8_t readflags [3];
  undefined8 local_28;
  SocketType local_20;
  
  if (this->init == true) {
    if (this->created == true) {
      if (this->waitingfordata == false) {
        local_20 = this->m_pAbortDesc->m_descriptors[0];
        local_28._0_4_ = this->rtpsock;
        local_28._4_4_ = this->rtcpsock;
        readflags[0] = '\0';
        readflags[1] = '\0';
        iVar2 = 0;
        readflags[2] = '\0';
        this->waitingfordata = true;
        iVar1 = RTPSelect((SocketType *)&local_28,readflags,3,(RTPTime)delay->m_t);
        this->waitingfordata = false;
        if ((-1 < iVar1) && (iVar1 = iVar2, this->created == true)) {
          if (readflags[2] != '\0') {
            RTPAbortDescriptors::ReadSignallingByte(this->m_pAbortDesc);
          }
          if (dataavailable != (bool *)0x0) {
            *dataavailable = readflags[1] != '\0' || readflags[0] != '\0';
          }
        }
      }
      else {
        iVar1 = -0x60;
      }
    }
    else {
      iVar1 = -0x71;
    }
  }
  else {
    iVar1 = -0x72;
  }
  return iVar1;
}

Assistant:

int RTPUDPv6Transmitter::WaitForIncomingData(const RTPTime &delay,bool *dataavailable)
{
	if (!init)
		return ERR_RTP_UDPV6TRANS_NOTINIT;
	
	MAINMUTEX_LOCK
		
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_NOTCREATED;
	}
	if (waitingfordata)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_ALREADYWAITING;
	}
	
	SocketType abortSocket = m_pAbortDesc->GetAbortSocket();
	SocketType socks[3] = { rtpsock, rtcpsock, abortSocket };
	int8_t readflags[3] = { 0, 0, 0 };
	const int idxRTP = 0;
	const int idxRTCP = 1;
	const int idxAbort = 2;

	waitingfordata = true;
	
	WAITMUTEX_LOCK
	MAINMUTEX_UNLOCK

	int status = RTPSelect(socks, readflags, 3, delay);
	if (status < 0)
	{
		MAINMUTEX_LOCK
		waitingfordata = false;
		MAINMUTEX_UNLOCK
		WAITMUTEX_UNLOCK
		return status;
	}
	
	MAINMUTEX_LOCK
	waitingfordata = false;
	if (!created) // destroy called
	{
		MAINMUTEX_UNLOCK;
		WAITMUTEX_UNLOCK
		return 0;
	}
		
	// if aborted, read from abort buffer
	if (readflags[idxAbort])
		m_pAbortDesc->ReadSignallingByte();
	
	if (dataavailable != 0)
	{
		if (readflags[idxRTP] || readflags[idxRTCP])
			*dataavailable = true;
		else
			*dataavailable = false;
	}	

	MAINMUTEX_UNLOCK
	WAITMUTEX_UNLOCK
	return 0;
}